

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

int __thiscall CLOptions::AsInt(CLOptions *this,string *param_name)

{
  size_type sVar1;
  ostream *poVar2;
  mapped_type *ppCVar3;
  key_type *in_RSI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
  *in_RDI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
  *in_stack_00000020;
  int local_4;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
          ::count(in_RDI,in_RSI);
  if (sVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[ERROR] CLOptions::AsInt() :: Parameter \"");
    poVar2 = std::operator<<(poVar2,(string *)in_RSI);
    poVar2 = std::operator<<(poVar2,"\" is not an integer!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
  }
  else {
    ppCVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
              ::operator[](in_stack_00000020,(key_type *)this);
    local_4 = CLParam<int>::getValue((CLParam<int> *)*ppCVar3);
  }
  return local_4;
}

Assistant:

int CLOptions::AsInt(const std::string& param_name)
{
    if (params_ints.count(param_name) == 0) {
        std::cerr << "[ERROR] CLOptions::AsInt() :: Parameter \"" << param_name << "\" is not an integer!" << std::endl;
        return 0 ;
    } else {
        return params_ints[param_name]->getValue();
    }
}